

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O3

Expression * __thiscall
wasm::SExpressionWasmBuilder::makeBrOnNull(SExpressionWasmBuilder *this,Element *s,bool onFail)

{
  Element *pEVar1;
  Expression *pEVar2;
  BrOn *this_00;
  undefined7 in_register_00000011;
  string_view sVar3;
  
  pEVar1 = Element::operator[](s,1);
  sVar3 = (string_view)getLabel(this,pEVar1,Break);
  pEVar1 = Element::operator[](s,2);
  pEVar2 = parseExpression(this,pEVar1);
  this_00 = (BrOn *)MixedArena::allocSpace(&this->wasm->allocator,0x38,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression._id = BrOnId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression.type.id = 0;
  this_00->op = (BrOnOp)CONCAT71(in_register_00000011,onFail);
  (this_00->name).super_IString.str = sVar3;
  this_00->ref = pEVar2;
  (this_00->castType).id = 0;
  BrOn::finalize(this_00);
  return (Expression *)this_00;
}

Assistant:

Expression* SExpressionWasmBuilder::makeBrOnNull(Element& s, bool onFail) {
  int i = 1;
  auto name = getLabel(*s[i++]);
  auto* ref = parseExpression(*s[i]);
  auto op = onFail ? BrOnNonNull : BrOnNull;
  return Builder(wasm).makeBrOn(op, name, ref);
}